

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_pack(REF_NODE ref_node,REF_INT *o2n,REF_INT *n2o)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_NODE copy;
  REF_INT node;
  REF_INT i;
  REF_INT *n2o_local;
  REF_INT *o2n_local;
  REF_NODE ref_node_local;
  
  _node = n2o;
  n2o_local = o2n;
  o2n_local = &ref_node->n;
  uVar1 = ref_node_deep_copy((REF_NODE *)&ref_private_macro_code_rss_1,ref_node->ref_mpi,ref_node);
  if (uVar1 == 0) {
    for (copy._0_4_ = 0; (int)copy < *o2n_local; copy._0_4_ = (int)copy + 1) {
      *(REF_GLOB *)(*(long *)(o2n_local + 4) + (long)(int)copy * 8) =
           _ref_private_macro_code_rss_1->global[_node[(int)copy]];
    }
    if (*o2n_local < o2n_local[1]) {
      for (copy._0_4_ = *o2n_local; (int)copy < o2n_local[1]; copy._0_4_ = (int)copy + 1) {
        *(long *)(*(long *)(o2n_local + 4) + (long)(int)copy * 8) = (long)(-2 - ((int)copy + 1));
      }
      *(undefined8 *)(*(long *)(o2n_local + 4) + (long)(o2n_local[1] + -1) * 8) = 0xffffffffffffffff
      ;
      o2n_local[2] = -2 - *o2n_local;
    }
    else {
      o2n_local[2] = -1;
    }
    for (copy._0_4_ = 0; (int)copy < *o2n_local; copy._0_4_ = (int)copy + 1) {
      *(REF_INT *)(*(long *)(o2n_local + 8) + (long)(int)copy * 4) =
           n2o_local[_ref_private_macro_code_rss_1->sorted_local[(int)copy]];
    }
    for (copy._0_4_ = 0; (int)copy < *o2n_local; copy._0_4_ = (int)copy + 1) {
      *(REF_INT *)(*(long *)(o2n_local + 10) + (long)(int)copy * 4) =
           _ref_private_macro_code_rss_1->part[_node[(int)copy]];
    }
    for (copy._0_4_ = 0; (int)copy < *o2n_local; copy._0_4_ = (int)copy + 1) {
      *(REF_INT *)(*(long *)(o2n_local + 0xc) + (long)(int)copy * 4) =
           _ref_private_macro_code_rss_1->age[_node[(int)copy]];
    }
    for (copy._0_4_ = 0; (int)copy < *o2n_local; copy._0_4_ = (int)copy + 1) {
      for (copy._4_4_ = 0; copy._4_4_ < 0xf; copy._4_4_ = copy._4_4_ + 1) {
        *(REF_DBL *)(*(long *)(o2n_local + 0xe) + (long)(copy._4_4_ + (int)copy * 0xf) * 8) =
             _ref_private_macro_code_rss_1->real[copy._4_4_ + _node[(int)copy] * 0xf];
      }
    }
    if (0 < o2n_local[0x10]) {
      for (copy._0_4_ = 0; (int)copy < *o2n_local; copy._0_4_ = (int)copy + 1) {
        for (copy._4_4_ = 0; copy._4_4_ < o2n_local[0x10]; copy._4_4_ = copy._4_4_ + 1) {
          *(REF_DBL *)
           (*(long *)(o2n_local + 0x12) + (long)(copy._4_4_ + o2n_local[0x10] * (int)copy) * 8) =
               _ref_private_macro_code_rss_1->aux
               [copy._4_4_ + _ref_private_macro_code_rss_1->naux * _node[(int)copy]];
        }
      }
    }
    ref_node_local._4_4_ = ref_node_free(_ref_private_macro_code_rss_1);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xd2,
             "ref_node_pack",(ulong)ref_node_local._4_4_,"release copy");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xb2,
           "ref_node_pack",(ulong)uVar1,"make a copy first");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_pack(REF_NODE ref_node, REF_INT *o2n,
                                 REF_INT *n2o) {
  REF_INT i, node;
  REF_NODE copy;
  RSS(ref_node_deep_copy(&copy, ref_node_mpi(ref_node), ref_node),
      "make a copy first");

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->global[node] = copy->global[n2o[node]];
  if (ref_node_n(ref_node) < ref_node_max(ref_node)) {
    for (node = ref_node_n(ref_node); node < ref_node_max(ref_node); node++)
      ref_node->global[node] = index2next(node + 1);
    ref_node->global[(ref_node->max) - 1] = REF_EMPTY;
    ref_node->blank = index2next(ref_node_n(ref_node));
  } else {
    ref_node->blank = REF_EMPTY;
  }

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->sorted_local[node] = o2n[copy->sorted_local[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->part[node] = copy->part[n2o[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->age[node] = copy->age[n2o[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    for (i = 0; i < REF_NODE_REAL_PER; i++)
      ref_node_real(ref_node, i, node) = ref_node_real(copy, i, n2o[node]);

  if (ref_node_naux(ref_node) > 0) {
    for (node = 0; node < ref_node_n(ref_node); node++)
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) = ref_node_aux(copy, i, n2o[node]);
  }

  RSS(ref_node_free(copy), "release copy");

  return REF_SUCCESS;
}